

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmStrictTargetComparison::operator()(cmStrictTargetComparison *this,cmTarget *t1,cmTarget *t2)

{
  int iVar1;
  char *__s1;
  char *__s2;
  
  iVar1 = strcmp((t1->Name)._M_dataplus._M_p,(t2->Name)._M_dataplus._M_p);
  if (iVar1 == 0) {
    __s1 = cmMakefile::GetCurrentBinaryDirectory(t1->Makefile);
    __s2 = cmMakefile::GetCurrentBinaryDirectory(t2->Makefile);
    iVar1 = strcmp(__s1,__s2);
  }
  return SUB41((uint)iVar1 >> 0x1f,0);
}

Assistant:

bool cmStrictTargetComparison::operator()(cmTarget const* t1,
                                          cmTarget const* t2) const
{
  int nameResult = strcmp(t1->GetName().c_str(), t2->GetName().c_str());
  if (nameResult == 0)
    {
    return strcmp(t1->GetMakefile()->GetCurrentBinaryDirectory(),
                  t2->GetMakefile()->GetCurrentBinaryDirectory()) < 0;
    }
  return nameResult < 0;
}